

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall
server_response::add_waiting_tasks
          (server_response *this,vector<server_task,_std::allocator<server_task>_> *tasks)

{
  pointer psVar1;
  common_log *log;
  server_task *task;
  pointer __v;
  unique_lock<std::mutex> lock;
  
  httplib::detail::std::unique_lock<std::mutex>::unique_lock(&lock,&this->mutex_results);
  psVar1 = (tasks->super__Vector_base<server_task,_std::allocator<server_task>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (__v = (tasks->super__Vector_base<server_task,_std::allocator<server_task>_>)._M_impl.
             super__Vector_impl_data._M_start; __v != psVar1; __v = __v + 1) {
    if (0 < common_log_verbosity_thold) {
      log = common_log_main();
      common_log_add(log,GGML_LOG_LEVEL_DEBUG,
                     "srv  %12.*s: add task %d to waiting list. current waiting = %d (before add)\n"
                     ,0xc,"add_waiting_tasks",(ulong)(uint)__v->id,
                     (int)(this->waiting_task_ids)._M_h._M_element_count);
    }
    httplib::detail::std::__detail::
    _Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&this->waiting_task_ids,&__v->id);
  }
  httplib::detail::std::unique_lock<std::mutex>::~unique_lock(&lock);
  return;
}

Assistant:

void add_waiting_tasks(const std::vector<server_task> & tasks) {
        std::unique_lock<std::mutex> lock(mutex_results);

        for (const auto & task : tasks) {
            SRV_DBG("add task %d to waiting list. current waiting = %d (before add)\n", task.id, (int) waiting_task_ids.size());
            waiting_task_ids.insert(task.id);
        }
    }